

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O0

exr_result_t
exr_get_attribute_list
          (exr_const_context_t ctxt,int part_index,exr_attr_list_access_mode_t mode,int32_t *count,
          exr_attribute_t **outlist)

{
  _internal_exr_part *p_Var1;
  exr_result_t eVar2;
  int *in_RCX;
  int in_EDX;
  uint in_ESI;
  _internal_exr_context *in_RDI;
  void *in_R8;
  _internal_exr_part *part;
  _internal_exr_context *pctxt;
  exr_attribute_t **srclist;
  exr_attribute_t **local_30;
  exr_result_t local_4;
  
  if (in_RDI == (_internal_exr_context *)0x0) {
    local_4 = 2;
  }
  else {
    if (in_RDI->mode == '\x01') {
      internal_exr_lock(in_RDI);
    }
    if (((int)in_ESI < 0) || (in_RDI->num_parts <= (int)in_ESI)) {
      if (in_RDI->mode == '\x01') {
        internal_exr_unlock(in_RDI);
      }
      local_4 = (*in_RDI->print_error)(in_RDI,4,"Part index (%d) out of range",(ulong)in_ESI);
    }
    else {
      p_Var1 = in_RDI->parts[(int)in_ESI];
      if (in_RCX == (int *)0x0) {
        if (in_RDI->mode == '\x01') {
          internal_exr_unlock(in_RDI);
        }
        local_4 = (*in_RDI->standard_error)(in_RDI,3);
      }
      else {
        if (in_EDX == 1) {
          local_30 = (p_Var1->attributes).sorted_entries;
        }
        else {
          if (in_EDX != 0) {
            if (in_RDI->mode == '\x01') {
              internal_exr_unlock(in_RDI);
            }
            eVar2 = (*in_RDI->standard_error)(in_RDI,3);
            return eVar2;
          }
          local_30 = (p_Var1->attributes).entries;
        }
        if ((in_R8 != (void *)0x0) && ((p_Var1->attributes).num_attributes <= *in_RCX)) {
          memcpy(in_R8,local_30,(long)(p_Var1->attributes).num_attributes << 3);
        }
        *in_RCX = (p_Var1->attributes).num_attributes;
        if (in_RDI->mode == '\x01') {
          internal_exr_unlock(in_RDI);
        }
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

exr_result_t
exr_get_attribute_list (
    exr_const_context_t         ctxt,
    int                         part_index,
    exr_attr_list_access_mode_t mode,
    int32_t*                    count,
    const exr_attribute_t**     outlist)
{
    exr_attribute_t** srclist;
    EXR_PROMOTE_CONST_CONTEXT_AND_PART_OR_ERROR (ctxt, part_index);

    if (!count)
        return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (
            pctxt->standard_error (pctxt, EXR_ERR_INVALID_ARGUMENT));

    if (mode == EXR_ATTR_LIST_SORTED_ORDER)
        srclist = part->attributes.sorted_entries;
    else if (mode == EXR_ATTR_LIST_FILE_ORDER)
        srclist = part->attributes.entries;
    else
        return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (
            pctxt->standard_error (pctxt, EXR_ERR_INVALID_ARGUMENT));

    if (outlist && *count >= part->attributes.num_attributes)
        memcpy (
            EXR_CONST_CAST (exr_attribute_t**, outlist),
            srclist,
            sizeof (exr_attribute_t*) *
                (size_t) part->attributes.num_attributes);
    *count = part->attributes.num_attributes;
    return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (EXR_ERR_SUCCESS);
}